

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

object * __thiscall pybind11::object::operator=(object *this,object *other)

{
  bool bVar1;
  undefined8 *in_RSI;
  object_api<pybind11::handle> *in_RDI;
  handle temp;
  object_api<pybind11::handle> *in_stack_ffffffffffffffd8;
  handle local_18;
  undefined8 *local_10;
  
  local_10 = in_RSI;
  bVar1 = pybind11::detail::object_api<pybind11::handle>::is(in_RDI,in_stack_ffffffffffffffd8);
  if (!bVar1) {
    pybind11::handle::inc_ref((handle *)in_RDI);
    pybind11::handle::handle<_object_*,_0>(&local_18,*(_object **)in_RDI);
    *(undefined8 *)in_RDI = *local_10;
    pybind11::handle::dec_ref((handle *)in_RDI);
  }
  return (object *)in_RDI;
}

Assistant:

object &operator=(const object &other) {
        // Skip inc_ref and dec_ref if both objects are the same
        if (!this->is(other)) {
            other.inc_ref();
            // Use temporary variable to ensure `*this` remains valid while
            // `Py_XDECREF` executes, in case `*this` is accessible from Python.
            handle temp(m_ptr);
            m_ptr = other.m_ptr;
            temp.dec_ref();
        }
        return *this;
    }